

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-test.c++
# Opt level: O2

Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> __thiscall
capnp::_::anon_unknown_0::TestNetworkAdapter::ConnectionImpl::receiveIncomingMessage
          (ConnectionImpl *this)

{
  int *piVar1;
  undefined8 *puVar2;
  Disposer *pDVar3;
  IncomingRpcMessage *pIVar4;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar5;
  PromiseNode *extraout_RDX_01;
  long in_RSI;
  Own<capnp::IncomingRpcMessage> *this_00;
  Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> PVar6;
  PromiseFulfillerPair<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> paf;
  Own<capnp::IncomingRpcMessage> local_198;
  Own<capnp::IncomingRpcMessage> local_188;
  undefined1 local_178 [344];
  
  this_00 = &local_198;
  if (*(char *)(in_RSI + 0x38) == '\x01') {
    kj::Exception::Exception((Exception *)local_178,(Exception *)(in_RSI + 0x40));
    kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::Promise
              ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)this,
               (Exception *)local_178);
    kj::Exception::~Exception((Exception *)local_178);
    pPVar5 = extraout_RDX;
  }
  else {
    puVar2 = *(undefined8 **)(in_RSI + 0x1f8);
    if (*(undefined8 **)(in_RSI + 0x218) == puVar2) {
      puVar2 = *(undefined8 **)(in_RSI + 0x240);
      if (puVar2 == (undefined8 *)0x0) {
        kj::newPromiseAndFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>();
        std::
        deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>,std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>>>
        ::emplace_back<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>>
                  ((deque<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>,std::allocator<kj::Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>>>>>>
                    *)(in_RSI + 0x198),
                   (Own<kj::PromiseFulfiller<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>_> *)
                   (local_178 + 0x10));
        (this->super_Connection).super_Connection._vptr_Connection = (_func_int **)local_178._0_8_;
        (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_178._8_8_;
        local_178._8_8_ = (IncomingRpcMessage *)0x0;
        kj::PromiseFulfillerPair<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::
        ~PromiseFulfillerPair
                  ((PromiseFulfillerPair<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)
                   local_178);
        pPVar5 = extraout_RDX_01;
        goto LAB_00354dd1;
      }
      (**(code **)*puVar2)(puVar2,local_178);
      local_198.disposer = (Disposer *)0x0;
      local_198.ptr = (IncomingRpcMessage *)0x0;
      kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::Promise
                ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)this,
                 (FixVoid<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)&local_198);
    }
    else {
      piVar1 = (int *)(*(long *)(in_RSI + 0x20) + 0x14);
      *piVar1 = *piVar1 + 1;
      pDVar3 = (Disposer *)*puVar2;
      pIVar4 = (IncomingRpcMessage *)puVar2[1];
      puVar2[1] = 0;
      local_178._0_8_ = pDVar3;
      std::
      deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>
      ::pop_front((deque<kj::Own<capnp::IncomingRpcMessage>,_std::allocator<kj::Own<capnp::IncomingRpcMessage>_>_>
                   *)(in_RSI + 0x1e8));
      local_178._8_8_ = (IncomingRpcMessage *)0x0;
      local_188.disposer = pDVar3;
      local_188.ptr = pIVar4;
      kj::Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::Promise
                ((Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)this,
                 (FixVoid<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *)&local_188);
      kj::Own<capnp::IncomingRpcMessage>::dispose(&local_188);
      this_00 = (Own<capnp::IncomingRpcMessage> *)local_178;
    }
    kj::Own<capnp::IncomingRpcMessage>::dispose(this_00);
    pPVar5 = extraout_RDX_00;
  }
LAB_00354dd1:
  PVar6.super_PromiseBase.node.ptr = pPVar5;
  PVar6.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>)PVar6.super_PromiseBase.node;
}

Assistant:

kj::Promise<kj::Maybe<kj::Own<IncomingRpcMessage>>> receiveIncomingMessage() override {
      KJ_IF_MAYBE(e, networkException) {
        return kj::cp(*e);
      }

      if (messages.empty()) {
        KJ_IF_MAYBE(f, fulfillOnEnd) {
          f->get()->fulfill();
          return kj::Maybe<kj::Own<IncomingRpcMessage>>(nullptr);
        } else {
          auto paf = kj::newPromiseAndFulfiller<kj::Maybe<kj::Own<IncomingRpcMessage>>>();
          fulfillers.push(kj::mv(paf.fulfiller));
          return kj::mv(paf.promise);
        }
      }